

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void do_cmd_wiz_play_item(command_conflict *cmd)

{
  object *poVar1;
  object *poVar2;
  _Bool _Var3;
  wchar_t wVar4;
  errr eVar5;
  command *pcVar6;
  object *next;
  object *prev;
  _Bool queue_failed;
  char *pcStack_38;
  char ch;
  char *done_msg;
  int local_28;
  _Bool rejected;
  wchar_t wStack_24;
  _Bool done;
  wchar_t object_changed;
  wchar_t display_all_prop;
  object *orig_obj;
  object *obj;
  command_conflict *cmd_local;
  
  orig_obj = (object *)0x0;
  _object_changed = (object *)0x0;
  wStack_24 = L'\x01';
  local_28 = 0;
  done_msg._7_1_ = 0;
  done_msg._6_1_ = 1;
  pcStack_38 = (char *)0x0;
  obj = (object *)cmd;
  wVar4 = cmd_get_arg_item((command *)cmd,"original_item",(object **)&object_changed);
  if ((wVar4 == L'\0') && (_object_changed != (object *)0x0)) {
    wVar4 = cmd_get_arg_item((command *)obj,"item",&orig_obj);
    if ((wVar4 != L'\0') || (orig_obj == (object *)0x0)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/cmd-wizard.c"
                    ,0x672,"void do_cmd_wiz_play_item(struct command *)");
    }
    wVar4 = cmd_get_arg_choice((command *)obj,"all_prop",&stack0xffffffffffffffdc);
    if (wVar4 != L'\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/cmd-wizard.c"
                    ,0x677,"void do_cmd_wiz_play_item(struct command *)");
    }
    wVar4 = cmd_get_arg_choice((command *)obj,"changed",&local_28);
    if (wVar4 != L'\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/cmd-wizard.c"
                    ,0x67c,"void do_cmd_wiz_play_item(struct command *)");
    }
  }
  else {
    wVar4 = cmd_get_arg_item((command *)obj,"item",&orig_obj);
    if (((wVar4 != L'\0') || (orig_obj == (object *)0x0)) &&
       (_Var3 = get_item(&orig_obj,"Play with which object? ","You have nothing to play with.",
                         *(cmd_code *)((long)&obj->kind + 4),(item_tester)0x0,L'\x0f'), !_Var3)) {
      return;
    }
    cmd_set_arg_item((command *)obj,"item",orig_obj);
    _object_changed = object_new();
    object_copy(_object_changed,orig_obj);
    cmd_set_arg_item((command *)obj,"original_item",_object_changed);
    wVar4 = cmd_get_arg_choice((command *)obj,"all_prop",&stack0xffffffffffffffdc);
    if (wVar4 != L'\0') {
      wStack_24 = L'\x01';
      cmd_set_arg_choice((command *)obj,"all_prop",L'\x01');
    }
    wVar4 = cmd_get_arg_choice((command *)obj,"changed",&local_28);
    if (wVar4 != L'\0') {
      local_28 = 0;
      cmd_set_arg_choice((command *)obj,"changed",L'\0');
    }
    screen_save();
  }
  wiz_display_item(orig_obj,wStack_24 != L'\0',player);
  _Var3 = get_com("[a]ccept [s]tatistics [r]eroll [t]weak [c]urse [q]uantity [k]nown? ",
                  (char *)((long)&prev + 7));
  if (_Var3) {
    prev._6_1_ = 0;
    switch(prev._7_1_) {
    case 0x41:
    case 0x61:
      done_msg._7_1_ = 1;
      done_msg._6_1_ = 0;
      if (local_28 != 0) {
        _Var3 = object_is_carried(player,orig_obj);
        if ((_Var3) &&
           ((orig_obj->number != _object_changed->number ||
            (orig_obj->weight != _object_changed->weight)))) {
          player->upkeep->total_weight =
               player->upkeep->total_weight -
               (uint)_object_changed->number * (int)_object_changed->weight;
          player->upkeep->total_weight =
               (uint)orig_obj->number * (int)orig_obj->weight + player->upkeep->total_weight;
        }
        wiz_play_item_standard_upkeep(player,orig_obj);
      }
      break;
    default:
      break;
    case 0x43:
    case 99:
      eVar5 = cmdq_push(CMD_WIZ_CURSE_ITEM);
      if (eVar5 == 0) {
        pcVar6 = cmdq_peek();
        cmd_set_arg_item(pcVar6,"item",orig_obj);
        pcVar6 = cmdq_peek();
        cmd_set_arg_choice(pcVar6,"update",L'\0');
      }
      else {
        prev._6_1_ = 1;
      }
      break;
    case 0x4b:
    case 0x6b:
      wStack_24 = (wchar_t)((wStack_24 != L'\0' ^ 0xffU) & 1);
      cmd_set_arg_choice((command *)obj,"all_prop",wStack_24);
      break;
    case 0x51:
    case 0x71:
      eVar5 = cmdq_push(CMD_WIZ_CHANGE_ITEM_QUANTITY);
      if (eVar5 == 0) {
        pcVar6 = cmdq_peek();
        cmd_set_arg_item(pcVar6,"item",orig_obj);
        pcVar6 = cmdq_peek();
        cmd_set_arg_choice(pcVar6,"update",L'\0');
      }
      else {
        prev._6_1_ = 1;
      }
      break;
    case 0x52:
    case 0x72:
      eVar5 = cmdq_push(CMD_WIZ_REROLL_ITEM);
      if (eVar5 == 0) {
        pcVar6 = cmdq_peek();
        cmd_set_arg_item(pcVar6,"item",orig_obj);
        pcVar6 = cmdq_peek();
        cmd_set_arg_choice(pcVar6,"update",L'\0');
      }
      else {
        prev._6_1_ = 1;
      }
      break;
    case 0x53:
    case 0x73:
      eVar5 = cmdq_push(CMD_WIZ_STAT_ITEM);
      if (eVar5 == 0) {
        pcVar6 = cmdq_peek();
        cmd_set_arg_item(pcVar6,"item",orig_obj);
      }
      else {
        prev._6_1_ = 1;
      }
      break;
    case 0x54:
    case 0x74:
      eVar5 = cmdq_push(CMD_WIZ_TWEAK_ITEM);
      if (eVar5 == 0) {
        pcVar6 = cmdq_peek();
        cmd_set_arg_item(pcVar6,"item",orig_obj);
        pcVar6 = cmdq_peek();
        cmd_set_arg_choice(pcVar6,"update",L'\0');
      }
      else {
        prev._6_1_ = 1;
      }
    }
    if ((((prev._6_1_ & 1) != 0) &&
        (_Var3 = get_check("Couldn\'t proceed.  Stop playing with item and lose all changes? "),
        _Var3)) && (done_msg._7_1_ = 1, local_28 != 0)) {
      pcStack_38 = "Bailed out.  Changes to item lost.";
    }
  }
  else {
    done_msg._7_1_ = 1;
    if (local_28 != 0) {
      pcStack_38 = "Changes ignored.";
    }
  }
  if (((done_msg._7_1_ & 1) == 0) && (eVar5 = cmdq_push_copy((command *)obj), eVar5 != 0)) {
    done_msg._7_1_ = 1;
    pcStack_38 = "Couldn\'t queue command.  Changes lost.";
  }
  if ((done_msg._7_1_ & 1) != 0) {
    if (((done_msg._6_1_ & 1) != 0) && (local_28 != 0)) {
      poVar1 = orig_obj->prev;
      poVar2 = orig_obj->next;
      mem_free(orig_obj->slays);
      orig_obj->slays = (_Bool *)0x0;
      mem_free(orig_obj->brands);
      orig_obj->brands = (_Bool *)0x0;
      mem_free(orig_obj->curses);
      orig_obj->curses = (curse_data *)0x0;
      object_copy(orig_obj,_object_changed);
      orig_obj->prev = poVar1;
      orig_obj->next = poVar2;
    }
    object_delete((chunk *)cave,(chunk *)player->cave,(object **)&object_changed);
    cmd_set_arg_item((command *)obj,"original_item",(object *)0x0);
    cmd_set_arg_choice((command *)obj,"changed",L'\0');
    screen_load();
    if (pcStack_38 != (char *)0x0) {
      msg("%s",pcStack_38);
    }
  }
  return;
}

Assistant:

void do_cmd_wiz_play_item(struct command *cmd)
{
	struct object *obj = NULL;
	struct object *orig_obj = NULL;
	int display_all_prop = 1;
	int object_changed = 0;
	bool done = false;
	bool rejected = true;
	const char *done_msg = NULL;
	char ch;

	/*
	 * When called to initiate a play session, "item" may be set, but
	 * "original_item" should not be set or should be set to NULL.
	 * Subsequent calls in the same session will have both set to
	 * non-NULL vales along with "all_prop" and "changed".
	 */
	if (cmd_get_arg_item(cmd, "original_item", &orig_obj) == CMD_OK &&
			orig_obj) {
		if (cmd_get_arg_item(cmd, "item", &obj) != CMD_OK || !obj) {
			assert(0);
			return;
		}
		if (cmd_get_arg_choice(cmd, "all_prop", &display_all_prop) !=
				CMD_OK) {
			assert(0);
			return;
		}
		if (cmd_get_arg_choice(cmd, "changed", &object_changed) !=
				CMD_OK) {
			assert(0);
			return;
		}
	} else {
		if (cmd_get_arg_item(cmd, "item", &obj) != CMD_OK || !obj) {
			if (!get_item(&obj, "Play with which object? ",
					"You have nothing to play with.",
					cmd->code, NULL, (USE_EQUIP |
					USE_INVEN | USE_QUIVER | USE_FLOOR))) {
				return;
			}
		}

		/* Remember the object. */
		cmd_set_arg_item(cmd, "item", obj);

		/* Make a copy so changes can be rejected. */
		orig_obj = object_new();
		object_copy(orig_obj, obj);
		cmd_set_arg_item(cmd, "original_item", orig_obj);

		/*
		 * Store whether all properties are shown or only the known
		 * ones.
		 */
		if (cmd_get_arg_choice(cmd, "all_prop", &display_all_prop) !=
				CMD_OK) {
			display_all_prop = 1;
			cmd_set_arg_choice(cmd, "all_prop", display_all_prop);
		}

		/*
		 * Store whether the working item may have changed from the
		 * original.
		 */
		if (cmd_get_arg_choice(cmd, "changed", &object_changed) !=
				CMD_OK) {
			object_changed = 0;
			cmd_set_arg_choice(cmd, "changed", object_changed);
		}

		/* Save screen. */
		screen_save();
	}

	/* Display the (possibly modified) item. */
	wiz_display_item(obj, display_all_prop != 0, player);

	/* Get choice. */
	if (get_com("[a]ccept [s]tatistics [r]eroll [t]weak [c]urse [q]uantity [k]nown? ", &ch)) {
		bool queue_failed = false;

		switch (ch) {
			case 'A':
			case 'a':
				/* Accept whatever changes were made. */
				done = true;
				rejected = false;
				if (object_changed) {
					/* Mark for updates. */
					if (object_is_carried(player, obj) &&
							(obj->number !=
							orig_obj->number ||
							obj->weight !=
							orig_obj->weight)) {
						/*
						 * Remove the weight of the old
						 * version.
						 */
						player->upkeep->total_weight -=
							orig_obj->number *
							orig_obj->weight;

						/*
						 * Add the weight of the new
						 * version.
						 */
						player->upkeep->total_weight +=
							obj->number *
							obj->weight;
					}
					wiz_play_item_standard_upkeep(player,
						obj);
				}
				break;

			case 'C':
			case 'c':
				/* Change a curse on the item. */
				if (cmdq_push(CMD_WIZ_CURSE_ITEM) == 0) {
					cmd_set_arg_item(cmdq_peek(), "item",
						obj);
					cmd_set_arg_choice(cmdq_peek(),
						"update", 0);
				} else {
					queue_failed = true;
				}
				break;

			case 'S':
			case 's':
				/* Get statistics about the item. */
				if (cmdq_push(CMD_WIZ_STAT_ITEM) == 0) {
					cmd_set_arg_item(cmdq_peek(), "item",
						obj);
				} else {
					queue_failed = true;
				}
				break;

			case 'R':
			case 'r':
				/* Reroll the item. */
				if (cmdq_push(CMD_WIZ_REROLL_ITEM) == 0) {
					cmd_set_arg_item(cmdq_peek(), "item",
						obj);
					cmd_set_arg_choice(cmdq_peek(),
						"update", 0);
				} else {
					queue_failed = true;
				}
				break;

			case 'T':
			case 't':
				/* Tweak the object's properties. */
				if (cmdq_push(CMD_WIZ_TWEAK_ITEM) == 0) {
					cmd_set_arg_item(cmdq_peek(), "item",
						obj);
					cmd_set_arg_choice(cmdq_peek(),
						"update", 0);
				} else {
					queue_failed = true;
				}
				break;

			case 'K':
			case 'k':
				/* Toggle whether showing all properties. */
				display_all_prop = !display_all_prop;
				cmd_set_arg_choice(cmd, "all_prop",
					display_all_prop);
				break;

			case 'Q':
			case 'q':
				/* Change the number of items in the stack. */
				if (cmdq_push(CMD_WIZ_CHANGE_ITEM_QUANTITY) == 0) {
					cmd_set_arg_item(cmdq_peek(), "item",
						obj);
					cmd_set_arg_choice(cmdq_peek(),
						"update", 0);
				} else {
					queue_failed = true;
				}
				break;

			default:
				/*
				 * Don't have to do anything, next pass through
				 * will ask again what's wanted.
				 */
				break;
		}

		if (queue_failed &&
				get_check("Couldn't proceed.  Stop playing with item and lose all changes? ")) {
			done = true;
			if (object_changed) {
				done_msg = "Bailed out.  Changes to item lost.";
			}
		}
	} else {
		done = true;
		if (object_changed) {
			done_msg = "Changes ignored.";
		}
	}

	if (!done) {
		/* Push the command back on the queue to be reexecuted. */
		if (cmdq_push_copy(cmd) != 0) {
			/* Failed.  Bail out without saving changes. */
			done = true;
			done_msg = "Couldn't queue command.  Changes lost.";
		}
	}

	if (done) {
		if (rejected && object_changed) {
			/*
			 * Restore to the original values.  The pile links
			 * require special handling because object_copy()
			 * resets them.
			 */
			struct object *prev = obj->prev;
			struct object *next = obj->next;

			/* Free slays, brands, and curses by hand. */
			mem_free(obj->slays);
			obj->slays = NULL;
			mem_free(obj->brands);
			obj->brands = NULL;
			mem_free(obj->curses);
			obj->curses = NULL;

			object_copy(obj, orig_obj);
			obj->prev = prev;
			obj->next = next;
		}

		/* Release the preserved copy. */
		object_delete(cave, player->cave, &orig_obj);

		/*
		 * Reset the original_item and changed arguments so repeating
		 * the command will start a new play session without a
		 * dangling reference to the deleted preserved copy.
		 */
		cmd_set_arg_item(cmd, "original_item", NULL);
		cmd_set_arg_choice(cmd, "changed", 0);

		/* Restore the screen. */
		screen_load();

		/* Provide some feedback. */
		if (done_msg) {
			msg("%s", done_msg);
		}
	}
}